

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer_e2e_test.cpp
# Opt level: O0

WaitResult<bool> __thiscall FindUserDataCallable::operator()(FindUserDataCallable *this)

{
  bool bVar1;
  __type _Var2;
  reference this_00;
  string *__lhs;
  WaitResult<bool> local_58;
  _Self local_50 [3];
  _Self local_38;
  iterator it;
  list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> peers;
  FindUserDataCallable *this_local;
  WaitResult<bool> result;
  
  udpdiscovery::Peer::ListDiscovered_abi_cxx11_
            ((list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> *)
             &it,this->peer_);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::begin
                 ((list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
                   *)&it);
  do {
    local_50[0]._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::end
                   ((list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
                     *)&it);
    bVar1 = std::operator!=(&local_38,local_50);
    if (!bVar1) {
      WaitResult<bool>::WaitResult((WaitResult<bool> *)((long)&this_local + 5));
LAB_00110a73:
      std::__cxx11::
      list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::~list
                ((list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
                  *)&it);
      local_58.result = (bool)this_local._7_1_;
      local_58.is_timeout = (bool)this_local._5_1_;
      local_58.has_result = (bool)this_local._6_1_;
      return local_58;
    }
    this_00 = std::_List_iterator<udpdiscovery::DiscoveredPeer>::operator*(&local_38);
    __lhs = udpdiscovery::DiscoveredPeer::user_data_abi_cxx11_(this_00);
    _Var2 = std::operator==(__lhs,&this->user_data_);
    if (_Var2) {
      WaitResult<bool>::WaitResult((WaitResult<bool> *)((long)&this_local + 5));
      this_local._5_2_ = CONCAT11(1,this_local._5_1_);
      this_local._7_1_ = 1;
      goto LAB_00110a73;
    }
    std::_List_iterator<udpdiscovery::DiscoveredPeer>::operator++(&local_38);
  } while( true );
}

Assistant:

WaitResult<bool> operator()() {
    std::list<udpdiscovery::DiscoveredPeer> peers = peer_.ListDiscovered();
    for (std::list<udpdiscovery::DiscoveredPeer>::iterator it = peers.begin();
         it != peers.end(); ++it) {
      if ((*it).user_data() == user_data_) {
        WaitResult<bool> result;
        result.has_result = true;
        result.result = true;

        return result;
      }
    }

    return WaitResult<bool>();
  }